

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

bool CheckConvertToUnixSlashes(string *input,string *output)

{
  bool bVar1;
  ostream *poVar2;
  string result;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)input);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_38);
  bVar1 = std::operator!=(&sStack_38,output);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToUnixSlashes - input: ");
    poVar2 = std::operator<<(poVar2,(string *)input);
    poVar2 = std::operator<<(poVar2," output: ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    poVar2 = std::operator<<(poVar2," expected: ");
    poVar2 = std::operator<<(poVar2,(string *)output);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return !bVar1;
}

Assistant:

static bool CheckConvertToUnixSlashes(std::string const& input,
                                      std::string const& output)
{
  std::string result = input;
  kwsys::SystemTools::ConvertToUnixSlashes(result);
  if (result != output) {
    std::cerr << "Problem with ConvertToUnixSlashes - input: " << input
              << " output: " << result << " expected: " << output << std::endl;
    return false;
  }
  return true;
}